

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *description_,App *parent)

{
  string *psVar1;
  string local_78;
  string local_58;
  allocator local_35 [20];
  allocator local_21;
  App *local_20;
  App *parent_local;
  string *description__local;
  App *this_local;
  
  this->_vptr_App = (_func_int **)&PTR_pre_callback_0013b888;
  local_20 = parent;
  parent_local = (App *)description_;
  description__local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->name_,"program",&local_21);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)description_);
  this->allow_extras_ = false;
  this->prefix_command_ = false;
  std::function<void_()>::function(&this->callback_);
  OptionDefaults::OptionDefaults(&this->option_defaults_);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::vector(&this->options_);
  ::std::__cxx11::string::string((string *)&this->footer_);
  this->help_ptr_ = (Option *)0x0;
  ::std::function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)>::
  function<std::__cxx11::string(&)(CLI::App_const*,CLI::Error_const&),void>
            ((function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)> *)
             &this->failure_message_,FailureMessage::simple_abi_cxx11_);
  std::
  vector<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->missing_);
  std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector(&this->parse_order_);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&this->parsed_subcommands_);
  std::
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ::vector(&this->subcommands_);
  this->ignore_case_ = false;
  this->fallthrough_ = false;
  this->parent_ = local_20;
  this->parsed_ = false;
  this->require_subcommand_min_ = 0;
  this->require_subcommand_max_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->group_,"Subcommands",local_35);
  ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  ::std::__cxx11::string::string((string *)&this->config_name_);
  this->config_required_ = false;
  this->config_ptr_ = (Option *)0x0;
  if (this->parent_ != (App *)0x0) {
    if (this->parent_->help_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_58,this->parent_->help_ptr_,false);
      psVar1 = Option::get_description_abi_cxx11_(this->parent_->help_ptr_);
      ::std::__cxx11::string::string((string *)&local_78,(string *)psVar1);
      set_help_flag(this,&local_58,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    OptionDefaults::operator=(&this->option_defaults_,&this->parent_->option_defaults_);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    this->allow_extras_ = (bool)(this->parent_->allow_extras_ & 1);
    this->prefix_command_ = (bool)(this->parent_->prefix_command_ & 1);
    this->ignore_case_ = (bool)(this->parent_->ignore_case_ & 1);
    this->fallthrough_ = (bool)(this->parent_->fallthrough_ & 1);
    ::std::__cxx11::string::operator=((string *)&this->group_,(string *)&this->parent_->group_);
    ::std::__cxx11::string::operator=((string *)&this->footer_,(string *)&this->parent_->footer_);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string description_, App *parent) : description_(std::move(description_)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(), parent_->help_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            prefix_command_ = parent_->prefix_command_;
            ignore_case_ = parent_->ignore_case_;
            fallthrough_ = parent_->fallthrough_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }